

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_structure.cpp
# Opt level: O3

string * __thiscall
(anonymous_namespace)::
dump<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,database *db,
          hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
          *index,ostream *os,index_pointer node,uint shifts)

{
  hash_type hVar1;
  bool bVar2;
  _Alloc_hider _Var3;
  char cVar4;
  uint uVar5;
  long *plVar6;
  ostream *poVar7;
  string *psVar8;
  undefined4 extraout_var;
  ostream *poVar9;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  uint uVar10;
  database *pdVar11;
  size_type *psVar12;
  database_reader *extraout_RDX;
  database_reader *archive;
  char cVar13;
  internal_node *__range2;
  long lVar14;
  ostringstream key_stream;
  ostringstream value_stream;
  string *this_00;
  string local_3a8;
  undefined1 local_388 [32];
  string local_368;
  string local_348;
  undefined1 local_328 [16];
  string local_318 [3];
  ios_base local_2b8 [272];
  _anonymous_namespace_ *local_1a8;
  database *local_1a0;
  ios_base local_138 [264];
  
  if (((ulong)db & 1) == 0) {
    if (((ulong)db & 2) != 0) {
      pstore::assert_failed
                ("node.is_address ()",
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/tools/index_structure/index_structure.cpp"
                 ,0x89);
    }
    cVar13 = '\x01';
    if ((database *)0x9 < db) {
      pdVar11 = db;
      cVar4 = '\x04';
      do {
        cVar13 = cVar4;
        if (pdVar11 < (database *)0x64) {
          cVar13 = cVar13 + -2;
          goto LAB_001090c2;
        }
        if (pdVar11 < (database *)0x3e8) {
          cVar13 = cVar13 + -1;
          goto LAB_001090c2;
        }
        if (pdVar11 < (database *)0x2710) goto LAB_001090c2;
        bVar2 = (database *)0x1869f < pdVar11;
        pdVar11 = (database *)((ulong)pdVar11 / 10000);
        cVar4 = cVar13 + '\x04';
      } while (bVar2);
      cVar13 = cVar13 + '\x01';
    }
LAB_001090c2:
    local_328._0_8_ = (element_type *)(local_328 + 0x10);
    std::__cxx11::string::_M_construct((ulong)local_328,cVar13);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_328._0_8_,local_328._8_4_,(unsigned_long)db);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)local_328,0,(char *)0x0,0x12444f);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar12 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar12) {
      lVar14 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar14;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
    }
    archive = (database_reader *)plVar6[1];
    __return_storage_ptr__->_M_string_length = (size_type)archive;
    *plVar6 = (long)psVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((element_type *)local_328._0_8_ != (element_type *)(local_328 + 0x10)) {
      operator_delete((void *)local_328._0_8_,(ulong)((long)local_318[0]._M_dataplus._M_p + 1));
      archive = extraout_RDX;
    }
    local_1a8 = this;
    local_1a0 = db;
    pstore::serialize::
    read<std::pair<pstore::uint128,pstore::extent<pstore::repo::compilation>>,pstore::serialize::archive::database_reader>
              ((pair<pstore::uint128,_pstore::extent<pstore::repo::compilation>_> *)local_328,
               (serialize *)&local_1a8,archive);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
    local_1a8._0_1_ = (serialize)0x7b;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_328,(char *)&local_1a8,1);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    local_1a8._0_1_ = (serialize)0x2c;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_1a8,1);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    local_1a8 = (_anonymous_namespace_ *)CONCAT71(local_1a8._1_7_,0x7d);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_1a8,1);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"{addr:",6);
    local_388._0_8_ = local_318[0]._M_dataplus._M_p;
    poVar7 = pstore::operator<<((ostream *)&local_1a8,(address *)local_388);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,",size:",6);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(__return_storage_ptr__->_M_dataplus)._M_p,
                        __return_storage_ptr__->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," [shape=record label=\"",0x16);
    std::__cxx11::stringbuf::str();
    anon_unknown.dwarf_1d604::escape((string *)local_388,&local_348);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(char *)local_388._0_8_,local_388._8_8_);
    local_3a8._M_dataplus._M_p._0_1_ = 0x7c;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_3a8,1);
    std::__cxx11::stringbuf::str();
    anon_unknown.dwarf_1d604::escape(&local_3a8,&local_368);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(char *)CONCAT71(local_3a8._M_dataplus._M_p._1_7_,
                                                local_3a8._M_dataplus._M_p._0_1_),
                        local_3a8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"]\n",3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_3a8._M_dataplus._M_p._1_7_,local_3a8._M_dataplus._M_p._0_1_) !=
        &local_3a8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_3a8._M_dataplus._M_p._1_7_,local_3a8._M_dataplus._M_p._0_1_),
                      local_3a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    if ((internal_node *)local_388._0_8_ != (internal_node *)(local_388 + 0x10)) {
      operator_delete((void *)local_388._0_8_,local_388._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
    psVar8 = (string *)std::ios_base::~ios_base(local_2b8);
  }
  else {
    uVar10 = (uint)index;
    if (uVar10 < 0x42) {
      if (((ulong)db & 2) != 0) {
LAB_0010979f:
        pstore::assert_failed
                  ("!node.is_heap ()",
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/tools/index_structure/index_structure.cpp"
                   ,0x74);
      }
      cVar13 = '\x01';
      if ((database *)0x9 < db) {
        pdVar11 = db;
        cVar4 = '\x04';
        do {
          cVar13 = cVar4;
          if (pdVar11 < (database *)0x64) {
            cVar13 = cVar13 + -2;
            goto LAB_00109404;
          }
          if (pdVar11 < (database *)0x3e8) {
            cVar13 = cVar13 + -1;
            goto LAB_00109404;
          }
          if (pdVar11 < (database *)0x2710) goto LAB_00109404;
          bVar2 = (database *)0x1869f < pdVar11;
          pdVar11 = (database *)((ulong)pdVar11 / 10000);
          cVar4 = cVar13 + '\x04';
        } while (bVar2);
        cVar13 = cVar13 + '\x01';
      }
LAB_00109404:
      local_328._0_8_ = local_328 + 0x10;
      std::__cxx11::string::_M_construct((ulong)local_328,cVar13);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_328._0_8_,local_328._8_4_,(unsigned_long)db);
      poVar7 = (ostream *)0x8;
      plVar6 = (long *)std::__cxx11::string::replace((ulong)local_328,0,(char *)0x0,0x1246bc);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar12 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar12) {
        lVar14 = plVar6[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar14;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
      }
      __return_storage_ptr__->_M_string_length = plVar6[1];
      *plVar6 = (long)psVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((string *)local_328._0_8_ != (string *)(local_328 + 0x10)) {
        operator_delete((void *)local_328._0_8_,(ulong)((long)local_318[0]._M_dataplus._M_p + 1));
      }
      pstore::index::details::internal_node::get_node
                ((pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
                  *)local_328,(database *)this,(index_pointer)db);
      _Var3._M_p = local_318[0]._M_dataplus._M_p;
      this_00 = (string *)CONCAT44(local_328._12_4_,local_328._8_4_);
      if (local_318[0]._M_dataplus._M_p == (pointer)0x0) {
        pstore::assert_failed
                  ("ptr != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/tools/index_structure/index_structure.cpp"
                   ,0x7b);
      }
      uVar5 = pstore::index::details::internal_node::size
                        ((internal_node *)local_318[0]._M_dataplus._M_p);
      psVar8 = (string *)CONCAT44(extraout_var,uVar5);
      if (uVar5 != 0) {
        lVar14 = 0;
        do {
          dump<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
                    ((string *)local_328,this,
                     *(database **)((long)((long)_Var3._M_p + 0x10U) + lVar14),
                     (hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                      *)(ulong)(uVar10 + 6),poVar7,node,(uint)this_00);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(__return_storage_ptr__->_M_dataplus)._M_p,
                              __return_storage_ptr__->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," -> ",4);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,(char *)local_328._0_8_,
                              CONCAT44(local_328._12_4_,local_328._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
          psVar8 = (string *)(local_328 + 0x10);
          if ((string *)local_328._0_8_ != psVar8) {
            operator_delete((void *)local_328._0_8_,(ulong)((long)local_318[0]._M_dataplus._M_p + 1)
                           );
            psVar8 = extraout_RAX;
          }
          lVar14 = lVar14 + 8;
        } while ((ulong)uVar5 << 3 != lVar14);
      }
    }
    else {
      if (((ulong)db & 2) != 0) goto LAB_0010979f;
      cVar13 = '\x01';
      if ((database *)0x9 < db) {
        pdVar11 = db;
        cVar4 = '\x04';
        do {
          cVar13 = cVar4;
          if (pdVar11 < (database *)0x64) {
            cVar13 = cVar13 + -2;
            goto LAB_001095b8;
          }
          if (pdVar11 < (database *)0x3e8) {
            cVar13 = cVar13 + -1;
            goto LAB_001095b8;
          }
          if (pdVar11 < (database *)0x2710) goto LAB_001095b8;
          bVar2 = (database *)0x1869f < pdVar11;
          pdVar11 = (database *)((ulong)pdVar11 / 10000);
          cVar4 = cVar13 + '\x04';
        } while (bVar2);
        cVar13 = cVar13 + '\x01';
      }
LAB_001095b8:
      local_328._0_8_ = local_328 + 0x10;
      std::__cxx11::string::_M_construct((ulong)local_328,cVar13);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_328._0_8_,local_328._8_4_,(unsigned_long)db);
      poVar7 = (ostream *)0x6;
      plVar6 = (long *)std::__cxx11::string::replace((ulong)local_328,0,(char *)0x0,0x1246c5);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar12 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar12) {
        lVar14 = plVar6[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar14;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar12;
      }
      __return_storage_ptr__->_M_string_length = plVar6[1];
      *plVar6 = (long)psVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((string *)local_328._0_8_ != (string *)(local_328 + 0x10)) {
        operator_delete((void *)local_328._0_8_,(ulong)((long)local_318[0]._M_dataplus._M_p + 1));
      }
      pstore::index::details::linear_node::get_node
                ((pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
                  *)local_328,(database *)this,(index_pointer)db);
      _Var3._M_p = local_318[0]._M_dataplus._M_p;
      psVar8 = (string *)CONCAT44(local_328._12_4_,local_328._8_4_);
      if (local_318[0]._M_dataplus._M_p == (pointer)0x0) {
        pstore::assert_failed
                  ("ptr != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/tools/index_structure/index_structure.cpp"
                   ,0x7b);
      }
      hVar1 = *(hash_type *)((long)local_318[0]._M_dataplus._M_p + 8);
      this_00 = psVar8;
      if (hVar1 != 0) {
        lVar14 = 0;
        do {
          dump<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
                    ((string *)local_328,this,
                     *(database **)((long)((long)_Var3._M_p + 0x10U) + lVar14),
                     (hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
                      *)(ulong)(uVar10 + 6),poVar7,node,(uint)this_00);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,(__return_storage_ptr__->_M_dataplus)._M_p,
                              __return_storage_ptr__->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," -> ",4);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,(char *)local_328._0_8_,
                              CONCAT44(local_328._12_4_,local_328._8_4_));
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,";\n",2);
          psVar8 = (string *)(local_328 + 0x10);
          if ((string *)local_328._0_8_ != psVar8) {
            operator_delete((void *)local_328._0_8_,(ulong)((long)local_318[0]._M_dataplus._M_p + 1)
                           );
            psVar8 = extraout_RAX_00;
          }
          lVar14 = lVar14 + 8;
        } while (hVar1 << 3 != lVar14);
      }
    }
    if (this_00 != (string *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      psVar8 = extraout_RAX_01;
    }
  }
  return psVar8;
}

Assistant:

std::string dump (pstore::database const & db, IndexType const & index, std::ostream & os,
                      index_pointer node, unsigned shifts) {
        if (node.is_leaf ()) {
            PSTORE_ASSERT (node.is_address ());
            return dump_leaf (db, index, os, node.to_address ());
        }
        return depth_is_internal_node (shifts)
                   ? dump_intermediate<internal_node> (db, index, os, node, shifts)
                   : dump_intermediate<linear_node> (db, index, os, node, shifts);
    }